

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

void __thiscall TemporaryRollback::~TemporaryRollback(TemporaryRollback *this)

{
  ChainstateManager *chainman;
  uint256 block_hash;
  long in_FS_OFFSET;
  uint256 local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  chainman = this->m_chainman;
  CBlockIndex::GetBlockHash(&local_38,this->m_invalidate_index);
  block_hash.super_base_blob<256U>.m_data._M_elems[8] =
       local_38.super_base_blob<256U>.m_data._M_elems[8];
  block_hash.super_base_blob<256U>.m_data._M_elems[9] =
       local_38.super_base_blob<256U>.m_data._M_elems[9];
  block_hash.super_base_blob<256U>.m_data._M_elems[10] =
       local_38.super_base_blob<256U>.m_data._M_elems[10];
  block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_38.super_base_blob<256U>.m_data._M_elems[0xb];
  block_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_38.super_base_blob<256U>.m_data._M_elems[0xc];
  block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_38.super_base_blob<256U>.m_data._M_elems[0xd];
  block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_38.super_base_blob<256U>.m_data._M_elems[0xe];
  block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_38.super_base_blob<256U>.m_data._M_elems[0xf];
  block_hash.super_base_blob<256U>.m_data._M_elems[0] =
       local_38.super_base_blob<256U>.m_data._M_elems[0];
  block_hash.super_base_blob<256U>.m_data._M_elems[1] =
       local_38.super_base_blob<256U>.m_data._M_elems[1];
  block_hash.super_base_blob<256U>.m_data._M_elems[2] =
       local_38.super_base_blob<256U>.m_data._M_elems[2];
  block_hash.super_base_blob<256U>.m_data._M_elems[3] =
       local_38.super_base_blob<256U>.m_data._M_elems[3];
  block_hash.super_base_blob<256U>.m_data._M_elems[4] =
       local_38.super_base_blob<256U>.m_data._M_elems[4];
  block_hash.super_base_blob<256U>.m_data._M_elems[5] =
       local_38.super_base_blob<256U>.m_data._M_elems[5];
  block_hash.super_base_blob<256U>.m_data._M_elems[6] =
       local_38.super_base_blob<256U>.m_data._M_elems[6];
  block_hash.super_base_blob<256U>.m_data._M_elems[7] =
       local_38.super_base_blob<256U>.m_data._M_elems[7];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x10];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x11];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x12];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x13];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x14];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x15];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x16];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x17];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x18];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x19];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x1a];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x1b];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x1c];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x1d];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x1e];
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_38.super_base_blob<256U>.m_data._M_elems[0x1f];
  ReconsiderBlock(chainman,block_hash);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~TemporaryRollback() {
        ReconsiderBlock(m_chainman, m_invalidate_index.GetBlockHash());
    }